

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

void __thiscall cmSourceFile::CheckExtension(cmSourceFile *this)

{
  string *__lhs;
  bool bVar1;
  allocator<char> local_51;
  string local_50;
  string realExt;
  
  cmsys::SystemTools::GetFilenameLastExtension(&realExt,&this->FullPath);
  if (realExt._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&realExt);
    std::__cxx11::string::operator=((string *)&this->Extension,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __lhs = &this->Extension;
  bVar1 = std::operator==(__lhs,"obj");
  if (!bVar1) {
    bVar1 = std::operator==(__lhs,"o");
    if (!bVar1) {
      bVar1 = std::operator==(__lhs,"lo");
      if (!bVar1) goto LAB_001b8d6e;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"EXTERNAL_OBJECT",&local_51);
  SetProperty(this,&local_50,"1");
  std::__cxx11::string::~string((string *)&local_50);
LAB_001b8d6e:
  if ((this->Language)._M_string_length == 0) {
    CheckLanguage(this,__lhs);
  }
  std::__cxx11::string::~string((string *)&realExt);
  return;
}

Assistant:

void cmSourceFile::CheckExtension()
{
  // Compute the extension.
  std::string realExt =
    cmSystemTools::GetFilenameLastExtension(this->FullPath);
  if (!realExt.empty()) {
    // Store the extension without the leading '.'.
    this->Extension = realExt.substr(1);
  }

  // Look for object files.
  if (this->Extension == "obj" || this->Extension == "o" ||
      this->Extension == "lo") {
    this->SetProperty("EXTERNAL_OBJECT", "1");
  }

  // Try to identify the source file language from the extension.
  if (this->Language.empty()) {
    this->CheckLanguage(this->Extension);
  }
}